

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TextureUnitCase::upload2dTexture
          (TextureUnitCase *this,int texNdx,Context *context)

{
  Texture2D *pTVar1;
  long lVar2;
  deUint32 err;
  TextureFormat texFormat;
  TransferFormat TVar3;
  long lVar4;
  int levelNdx;
  ulong uVar5;
  long lVar6;
  ConstPixelBufferAccess access;
  
  pTVar1 = (this->m_textures2d).
           super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
           super__Vector_impl_data._M_start
           [(this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[texNdx]];
  texFormat = glu::mapGLInternalFormat
                        ((this->m_textureParams).
                         super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                         ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat);
  TVar3 = glu::getTransferFormat(texFormat);
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  lVar6 = 8;
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    lVar2 = *(long *)&(pTVar1->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data;
    if ((long)(int)(((long)(pTVar1->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar2) / 0x28) <=
        (long)uVar5) break;
    if (*(long *)(*(long *)&(pTVar1->super_TextureLevelPyramid).m_data.
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data + lVar6) != 0) {
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&access,(ConstPixelBufferAccess *)(lVar2 + lVar4));
      (*context->_vptr_Context[0x11])
                (context,0xde1,uVar5 & 0xffffffff,
                 (ulong)(this->m_textureParams).
                        super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                        ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat,
                 (ulong)(uint)access.m_size.m_data[0],(ulong)(uint)access.m_size.m_data[1],0,TVar3,
                 (ulong)TVar3 >> 0x20,access.m_data);
      err = (*context->_vptr_Context[0x79])(context);
      glu::checkError(err,"Set 2d texture image data",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                      ,0x433);
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x28;
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

void TextureUnitCase::upload2dTexture (int texNdx, sglr::Context& context)
{
	int						ndx2d		= m_ndxTexType[texNdx];
	const tcu::Texture2D*	texture		= m_textures2d[ndx2d];
	glu::TransferFormat		formatGl	= glu::getTransferFormat(glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat));

	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	for (int levelNdx = 0; levelNdx < texture->getNumLevels(); levelNdx++)
	{
		if (texture->isLevelEmpty(levelNdx))
			continue;

		tcu::ConstPixelBufferAccess		access	= texture->getLevel(levelNdx);
		int								width	= access.getWidth();
		int								height	= access.getHeight();

		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

		context.texImage2D(GL_TEXTURE_2D, levelNdx, m_textureParams[texNdx].internalFormat, width, height, 0 /* border */, formatGl.format, formatGl.dataType, access.getDataPtr());
		GLU_EXPECT_NO_ERROR(context.getError(), "Set 2d texture image data");
	}
}